

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_MergeExtensions_Test::TestBody
          (ReflectionOpsTest_MergeExtensions_Test *this)

{
  ConstType CVar1;
  ConstType value;
  allocator<char> local_a1;
  int32_t i;
  undefined1 local_70 [8];
  TestAllExtensions message2;
  TestAllExtensions message;
  ReflectionOpsTest_MergeExtensions_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_70);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  CVar1 = proto2_unittest::TestAllExtensions::
          GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                    ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                      *)&proto2_unittest::optional_int32_extension);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false>
            ((TestAllExtensions *)local_70,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::optional_int32_extension,CVar1);
  proto2_unittest::TestAllExtensions::
  ClearExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::optional_int32_extension);
  value = proto2_unittest::TestAllExtensions::
          GetExtension<google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false,_0>
                    ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                      *)proto2_unittest::optional_string_extension);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false>
            ((TestAllExtensions *)local_70,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
              *)proto2_unittest::optional_string_extension,value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"something else",&local_a1);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
              *)proto2_unittest::optional_string_extension,(ConstType)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_a1);
  CVar1 = proto2_unittest::TestAllExtensions::
          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                    ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                      *)&proto2_unittest::repeated_int32_extension,1);
  proto2_unittest::TestAllExtensions::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false>
            ((TestAllExtensions *)local_70,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::repeated_int32_extension,CVar1);
  CVar1 = proto2_unittest::TestAllExtensions::
          GetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                    ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                      *)&proto2_unittest::repeated_int32_extension,0);
  proto2_unittest::TestAllExtensions::
  ClearExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::repeated_int32_extension);
  proto2_unittest::TestAllExtensions::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
             (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::repeated_int32_extension,CVar1);
  ReflectionOps::Merge((Message *)local_70,(Message *)&message2.field_0._impl_._cached_size_);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(ReflectionOpsTest, MergeExtensions) {
  // Note:  Copy is implemented in terms of Merge() so technically the Copy
  //   test already tested most of this.

  unittest::TestAllExtensions message, message2;

  TestUtil::SetAllExtensions(&message);

  // This field will test merging into an empty spot.
  message2.SetExtension(
      unittest::optional_int32_extension,
      message.GetExtension(unittest::optional_int32_extension));
  message.ClearExtension(unittest::optional_int32_extension);

  // This tests overwriting.
  message2.SetExtension(
      unittest::optional_string_extension,
      message.GetExtension(unittest::optional_string_extension));
  message.SetExtension(unittest::optional_string_extension, "something else");

  // This tests concatenating.
  message2.AddExtension(
      unittest::repeated_int32_extension,
      message.GetExtension(unittest::repeated_int32_extension, 1));
  int32_t i = message.GetExtension(unittest::repeated_int32_extension, 0);
  message.ClearExtension(unittest::repeated_int32_extension);
  message.AddExtension(unittest::repeated_int32_extension, i);

  ReflectionOps::Merge(message2, &message);

  TestUtil::ExpectAllExtensionsSet(message);
}